

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-ipv6.c
# Opt level: O2

int run_test_udp_ipv6_only(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    fprintf(_stderr,"%s\n","IPv6 not supported");
    fflush(_stderr);
    return 7;
  }
  do_test(ipv6_recv_fail,1);
  eval_a = (int64_t)recv_cb_called;
  eval_b = 0;
  if (eval_a == 0) {
    eval_a = 1;
    eval_b = (int64_t)send_cb_called;
    if (eval_b == 1) {
      return 0;
    }
    pcVar4 = "send_cb_called";
    pcVar3 = "1";
    uVar2 = 0x100;
  }
  else {
    pcVar4 = "0";
    pcVar3 = "recv_cb_called";
    uVar2 = 0xff;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-ipv6.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(udp_ipv6_only) {
  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  do_test(ipv6_recv_fail, UV_UDP_IPV6ONLY);

  ASSERT_OK(recv_cb_called);
  ASSERT_EQ(1, send_cb_called);

  return 0;
}